

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

int map_set_(map_base_t *m,char *key,void *value,int vsize)

{
  map_node_t *pmVar1;
  map_node_t **ppmVar2;
  map_node_t *pmVar3;
  uint uVar4;
  map_node_t **ppmVar5;
  size_t sVar6;
  long lVar7;
  map_node_t *__ptr;
  char cVar8;
  uint uVar9;
  char *pcVar10;
  map_node_t *pmVar11;
  void *__dest;
  
  ppmVar5 = map_getref(m,key);
  if (ppmVar5 == (map_node_t **)0x0) {
    sVar6 = strlen(key);
    uVar4 = (uint)sVar6;
    lVar7 = (long)(int)((~uVar4 & 7) + uVar4 + 1);
    __ptr = (map_node_t *)malloc(vsize + lVar7 + 0x18);
    if (__ptr == (map_node_t *)0x0) {
      __ptr = (map_node_t *)0x0;
    }
    else {
      memcpy(__ptr + 1,key,(long)(int)(uVar4 + 1));
      cVar8 = *key;
      if (cVar8 == '\0') {
        uVar4 = 0x1505;
      }
      else {
        pcVar10 = key + 1;
        uVar4 = 0x1505;
        do {
          uVar4 = (int)cVar8 ^ uVar4 * 0x21;
          cVar8 = *pcVar10;
          pcVar10 = pcVar10 + 1;
        } while (cVar8 != '\0');
      }
      __ptr->hash = uVar4;
      __dest = (void *)((long)&__ptr[1].hash + lVar7);
      __ptr->value = __dest;
      memcpy(__dest,value,(long)vsize);
    }
    if (__ptr == (map_node_t *)0x0) {
      return -1;
    }
    uVar4 = m->nbuckets;
    lVar7 = (long)(int)uVar4;
    if (uVar4 <= m->nnodes) {
      uVar9 = uVar4 * 2;
      if (uVar4 == 0) {
        pmVar11 = (map_node_t *)0x0;
        uVar9 = 1;
      }
      else {
        ppmVar5 = m->buckets;
        pmVar11 = (map_node_t *)0x0;
        do {
          pmVar1 = ppmVar5[lVar7 + -1];
          while (pmVar3 = pmVar1, pmVar3 != (map_node_t *)0x0) {
            pmVar1 = pmVar3->next;
            pmVar3->next = pmVar11;
            pmVar11 = pmVar3;
          }
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      ppmVar5 = (map_node_t **)realloc(m->buckets,(long)(int)uVar9 << 3);
      if (ppmVar5 != (map_node_t **)0x0) {
        m->buckets = ppmVar5;
        m->nbuckets = uVar9;
      }
      if ((m->buckets != (map_node_t **)0x0) &&
         (memset(m->buckets,0,(ulong)m->nbuckets << 3), pmVar11 != (map_node_t *)0x0)) {
        uVar4 = m->nbuckets;
        do {
          pmVar1 = pmVar11->next;
          uVar9 = pmVar11->hash & uVar4 - 1;
          ppmVar2 = m->buckets;
          pmVar11->next = ppmVar2[(int)uVar9];
          ppmVar2[(int)uVar9] = pmVar11;
          pmVar11 = pmVar1;
        } while (pmVar1 != (map_node_t *)0x0);
      }
      if (ppmVar5 == (map_node_t **)0x0) {
        free(__ptr);
        return -1;
      }
    }
    uVar4 = m->nbuckets - 1 & __ptr->hash;
    ppmVar5 = m->buckets;
    __ptr->next = ppmVar5[(int)uVar4];
    ppmVar5[(int)uVar4] = __ptr;
    m->nnodes = m->nnodes + 1;
  }
  else {
    memcpy((*ppmVar5)->value,value,(long)vsize);
  }
  return 0;
}

Assistant:

int map_set_(map_base_t *m, const char *key, void *value, int vsize) {
  int n, err;
  map_node_t **next, *node;
  /* Find & replace existing node */
  next = map_getref(m, key);
  if (next) {
    memcpy((*next)->value, value, vsize);
    return 0;
  }
  /* Add new node */
  node = map_newnode(key, value, vsize);
  if (node == NULL) goto fail;
  if (m->nnodes >= m->nbuckets) {
    n = (m->nbuckets > 0) ? (m->nbuckets << 1) : 1;
    err = map_resize(m, n);
    if (err) goto fail;
  }
  map_addnode(m, node);
  m->nnodes++;
  return 0;
  fail:
  if (node) free(node);
  return -1;
}